

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_gainer_process_pcm_frames
                    (ma_gainer *pGainer,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  long in_RDI;
  ma_uint64 in_stack_00000278;
  void *in_stack_00000280;
  void *in_stack_00000288;
  ma_gainer *in_stack_00000290;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = ma_gainer_process_pcm_frames_internal
                        (in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_gainer_process_pcm_frames(ma_gainer* pGainer, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    ma_gainer_process_pcm_frames_internal() marks pFramesOut and pFramesIn with MA_RESTRICT which
    helps with auto-vectorization.
    */
    return ma_gainer_process_pcm_frames_internal(pGainer, pFramesOut, pFramesIn, frameCount);
}